

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_union(_Bool copy_on_write)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  uint64_t uVar1;
  roaring_bitmap_t *r_01;
  uint64_t uVar2;
  uint32_t val;
  unsigned_long b;
  uint32_t val_00;
  
  val_00 = 0;
  r = roaring_bitmap_create_with_capacity(0);
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x709);
  r_00 = roaring_bitmap_create_with_capacity(0);
  (r_00->high_low_container).flags = (r_00->high_low_container).flags & 0xfe | copy_on_write;
  _assert_true((unsigned_long)r_00,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x70c);
  b = 1;
  val = 0;
  do {
    roaring_bitmap_add(r,val_00);
    roaring_bitmap_add(r_00,val);
    uVar1 = roaring_bitmap_get_cardinality(r_00);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                      ,0x711);
    uVar1 = roaring_bitmap_get_cardinality(r);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                      ,0x712);
    val = val + 3;
    val_00 = val_00 + 2;
    b = b + 1;
  } while (b != 0x65);
  r_01 = roaring_bitmap_or(r,r_00);
  uVar1 = roaring_bitmap_get_cardinality(r_01);
  uVar2 = roaring_bitmap_or_cardinality(r,r_00);
  _assert_true((ulong)(uVar1 == uVar2),
               "roaring_bitmap_get_cardinality(r1_or_r2) == roaring_bitmap_or_cardinality(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x717);
  (r_01->high_low_container).flags = ((r_01->high_low_container).flags & 0xfe) + copy_on_write;
  uVar1 = roaring_bitmap_get_cardinality(r_01);
  _assert_int_equal(uVar1,0xa6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x71a);
  roaring_bitmap_free(r_01);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return;
}

Assistant:

void test_union(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    assert_true(r1);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);
    assert_true(r2);

    for (uint32_t i = 0; i < 100; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r2, 3 * i);
        assert_int_equal(roaring_bitmap_get_cardinality(r2), i + 1);
        assert_int_equal(roaring_bitmap_get_cardinality(r1), i + 1);
    }

    roaring_bitmap_t *r1_or_r2 = roaring_bitmap_or(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_or_r2) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_set_copy_on_write(r1_or_r2, copy_on_write);
    assert_int_equal(roaring_bitmap_get_cardinality(r1_or_r2), 166);

    roaring_bitmap_free(r1_or_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);
}